

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

hash_iter_t * hash_table_iter_next(hash_iter_t *itor)

{
  int iVar1;
  hash_entry_s *phVar2;
  hash_table_t *phVar3;
  ulong uVar4;
  long lVar5;
  
  if ((itor->ent == (hash_entry_t *)0x0) ||
     (phVar2 = itor->ent->next, itor->ent = phVar2, phVar2 == (hash_entry_s *)0x0)) {
    phVar3 = itor->ht;
    uVar4 = itor->idx;
    iVar1 = phVar3->size;
    for (lVar5 = uVar4 << 5;
        (uVar4 < (ulong)(long)iVar1 && (*(long *)((long)&phVar3->table->key + lVar5) == 0));
        lVar5 = lVar5 + 0x20) {
      uVar4 = uVar4 + 1;
      itor->idx = uVar4;
    }
    if ((long)iVar1 == uVar4) {
      ckd_free(itor);
      itor = (hash_iter_t *)0x0;
    }
    else {
      itor->ent = (hash_entry_t *)((long)&phVar3->table->key + lVar5);
      itor->idx = uVar4 + 1;
    }
  }
  return itor;
}

Assistant:

hash_iter_t *
hash_table_iter_next(hash_iter_t *itor)
{
	/* If there is an entry, walk down its list. */
	if (itor->ent)
		itor->ent = itor->ent->next;
	/* If we got to the end of the chain, or we had no entry, scan
	 * forward in the table to find the next non-empty bucket. */
	if (itor->ent == NULL) {
		while (itor->idx < itor->ht->size
		       && itor->ht->table[itor->idx].key == NULL) 
			++itor->idx;
		/* If we did not find one then delete the iterator and
		 * return NULL. */
		if (itor->idx == itor->ht->size) {
			hash_table_iter_free(itor);
			return NULL;
		}
		/* Otherwise use this next entry. */
		itor->ent = itor->ht->table + itor->idx;
		/* Increase idx for the next time around. */
		++itor->idx;
	}
	return itor;
}